

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmltree.c
# Opt level: O0

int main(int argc,char **argv)

{
  tchar_t local_268 [8];
  tchar_t fileName [256];
  stream *Input;
  parsercontext p;
  char **argv_local;
  int argc_local;
  
  p.StrTab.Table._Used = (size_t)argv;
  if (argc == 2) {
    ParserContext_Init((parsercontext *)&Input,(nodemeta *)0x0,(cc_memheap *)0x0,(cc_memheap *)0x0);
    EBML_Init((parsercontext *)&Input);
    Node_FromStr(&Input,local_268,0x100,*(char **)(p.StrTab.Table._Used + 8));
    fileName._248_8_ = StreamOpen(&Input,local_268,1);
    if ((stream *)fileName._248_8_ == (stream *)0x0) {
      fprintf(_stderr,"error: ebmltree cannot open file \"%s\"\r\n",
              *(undefined8 *)(p.StrTab.Table._Used + 8));
    }
    else {
      OutputTree((stream *)fileName._248_8_);
      StreamClose((stream *)fileName._248_8_);
    }
    ParserContext_Done((parsercontext *)&Input);
    argv_local._4_4_ = 0;
  }
  else {
    fprintf(_stderr,"Usage: ebmltree [ebml_file]\r\n");
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, const char *argv[])
{
    parsercontext p;
    struct stream *Input;

    if (argc != 2)
    {
        fprintf(stderr, "Usage: ebmltree [ebml_file]\r\n");
        return 1;
    }

    // Core-C init phase
    ParserContext_Init(&p,NULL,NULL,NULL);
    // EBML Init
    EBML_Init(&p);

    // open the file to parse
    tchar_t fileName[MAXPATH];
    Node_FromStr(&p, fileName, TSIZEOF(fileName), argv[1]);
    Input = StreamOpen(&p,fileName,SFLAG_RDONLY);
    if (Input == NULL)
        fprintf(stderr, "error: ebmltree cannot open file \"%s\"\r\n",argv[1]);
    else
    {
        OutputTree(Input);

        StreamClose(Input);
    }

    // Core-C ending
    ParserContext_Done(&p);

    return 0;
}